

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O1

ze_result_t __thiscall
tracing_layer::APITracerContextImp::enableTracingImp
          (APITracerContextImp *this,APITracerImp *tracerImp,ze_bool_t enable)

{
  size_t *psVar1;
  tracingState_t tVar2;
  int iVar3;
  _List_node_base *p_Var4;
  size_t sVar5;
  ostream *poVar6;
  ze_result_t zVar7;
  APITracerImp *local_28;
  
  local_28 = tracerImp;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->traceTableMutex);
  if (iVar3 == 0) {
    tVar2 = local_28->tracingState;
    if (tVar2 == disabledWaitingState) {
      zVar7 = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    else if (tVar2 == enabledState) {
      zVar7 = ZE_RESULT_SUCCESS;
      if (enable == '\0') {
        std::__cxx11::
        list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::remove
                  (&this->enabledTracerImpList,(char *)&local_28);
        local_28->tracingState = disabledWaitingState;
        sVar5 = updateTracerArrays(this);
        if (sVar5 == 0) {
          local_28->tracingState = disabledState;
        }
      }
    }
    else {
      if (tVar2 != disabledState) goto LAB_0015b371;
      zVar7 = ZE_RESULT_SUCCESS;
      if (enable != '\0') {
        p_Var4 = (_List_node_base *)operator_new(0x18);
        p_Var4[1]._M_next = (_List_node_base *)local_28;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->enabledTracerImpList).
                  super__List_base<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_28->tracingState = enabledState;
        updateTracerArrays(this);
        zVar7 = ZE_RESULT_SUCCESS;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->traceTableMutex);
    return zVar7;
  }
  std::__throw_system_error(iVar3);
LAB_0015b371:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Abort was called at ",0x14);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x199);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," line in file: ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/source/layers/tracing/tracing_imp.cpp"
             ,0x6f);
  std::endl<char,std::char_traits<char>>(poVar6);
  abort();
}

Assistant:

ze_result_t
APITracerContextImp::enableTracingImp(struct APITracerImp *tracerImp,
                                      ze_bool_t enable) {
    std::lock_guard<std::mutex> lock(traceTableMutex);
    ze_result_t result;
    switch (tracerImp->tracingState) {
    case disabledState:
        if (enable) {
            enabledTracerImpList.push_back(tracerImp);
            tracerImp->tracingState = enabledState;
            updateTracerArrays();
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case enabledState:
        if (!enable) {
            enabledTracerImpList.remove(tracerImp);
            tracerImp->tracingState = disabledWaitingState;
            if (updateTracerArrays() == 0)
                tracerImp->tracingState = disabledState;
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case disabledWaitingState:
        result = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
        break;

    default:
        result = ZE_RESULT_ERROR_UNINITIALIZED;
        UNRECOVERABLE_IF(true);
        break;
    }
    return result;
}